

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void neon_load_element(TCGContext_conflict1 *tcg_ctx,TCGv_i32 var,int reg,int ele,MemOp mop)

{
  long offset_00;
  long offset;
  MemOp mop_local;
  int ele_local;
  int reg_local;
  TCGv_i32 var_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  offset_00 = neon_element_offset(reg,ele,mop & MO_64);
  if (mop == MO_8) {
    tcg_gen_ld8u_i32(tcg_ctx,var,tcg_ctx->cpu_env,offset_00);
  }
  else if (mop == MO_16) {
    tcg_gen_ld16u_i32(tcg_ctx,var,tcg_ctx->cpu_env,offset_00);
  }
  else {
    if (mop != MO_32) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate.c"
                 ,0x4bd,(char *)0x0);
    }
    tcg_gen_ld_i32(tcg_ctx,var,tcg_ctx->cpu_env,offset_00);
  }
  return;
}

Assistant:

static void neon_load_element(TCGContext *tcg_ctx, TCGv_i32 var, int reg, int ele, MemOp mop)
{
    long offset = neon_element_offset(reg, ele, mop & MO_SIZE);

    switch (mop) {
    case MO_UB:
        tcg_gen_ld8u_i32(tcg_ctx, var, tcg_ctx->cpu_env, offset);
        break;
    case MO_UW:
        tcg_gen_ld16u_i32(tcg_ctx, var, tcg_ctx->cpu_env, offset);
        break;
    case MO_UL:
        tcg_gen_ld_i32(tcg_ctx, var, tcg_ctx->cpu_env, offset);
        break;
    default:
        g_assert_not_reached();
        break;
    }
}